

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_graph_utilities.cpp
# Opt level: O1

void __thiscall
test_graph_utilities_pseudo_peripheral_vertex_Test::TestBody
          (test_graph_utilities_pseudo_peripheral_vertex_Test *this)

{
  long *plVar1;
  long *plVar2;
  bool bVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  char *pcVar7;
  StringLike<const_char_*> *regex;
  StringLike<const_char_*> *regex_00;
  initializer_list<std::pair<unsigned_long,_unsigned_long>_> edge_graph;
  DeathTest *gtest_dt;
  Adjacency_Graph<false> graph_saad;
  AssertionResult gtest_ar;
  AssertHelper local_288;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_280;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_278;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_260;
  Adjacency_Graph<false> local_248;
  undefined1 local_218 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_210;
  pointer local_208;
  pointer puStack_200;
  pointer local_1f8;
  pointer puStack_1f0;
  undefined8 local_1e8;
  undefined8 local_1e0;
  undefined8 local_1d8;
  undefined8 local_1d0;
  undefined8 local_1c8;
  undefined8 local_1c0;
  undefined8 local_1b8;
  undefined8 local_1b0;
  undefined8 local_1a8;
  undefined8 local_1a0;
  undefined8 local_198;
  undefined8 local_190;
  undefined8 local_188;
  undefined8 local_180;
  undefined8 local_178;
  undefined8 local_170;
  undefined8 local_168;
  undefined8 local_160;
  undefined8 local_158;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 local_140;
  undefined8 local_138;
  undefined8 local_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  
  local_218 = (undefined1  [8])0x0;
  _Stack_210._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&DAT_00000006;
  local_208 = (pointer)0x0;
  puStack_200 = (pointer)0x8;
  local_1f8 = (pointer)0x1;
  puStack_1f0 = (pointer)0x7;
  local_1e8 = 1;
  local_1e0 = 8;
  local_1d8 = 1;
  local_1d0 = 10;
  local_1c8 = 1;
  local_1c0 = 0xc;
  local_1b8 = 2;
  local_1b0 = 6;
  local_1a8 = 2;
  local_1a0 = 7;
  local_198 = 2;
  local_190 = 9;
  local_188 = 3;
  local_180 = 0xb;
  local_178 = 3;
  local_170 = 0xc;
  local_168 = 3;
  local_160 = 0xe;
  local_158 = 4;
  local_150 = 9;
  local_148 = 4;
  local_140 = 10;
  local_138 = 4;
  local_130 = 0xb;
  local_128 = 4;
  local_120 = 0xd;
  local_118 = 5;
  local_110 = 0xd;
  local_108 = 5;
  local_100 = 0xe;
  local_f8 = 6;
  local_f0 = 7;
  local_e8 = 6;
  local_e0 = 8;
  local_d8 = 7;
  local_d0 = 8;
  local_c8 = 7;
  local_c0 = 9;
  local_b8 = 7;
  local_b0 = 10;
  local_a8 = 9;
  local_a0 = 10;
  local_98 = 10;
  local_90 = 0xb;
  local_88 = 10;
  local_80 = 0xc;
  local_78 = 0xb;
  local_70 = 0xc;
  local_68 = 0xb;
  local_60 = 0xd;
  local_58 = 0xb;
  local_50 = 0xe;
  local_48 = 0xd;
  local_40 = 0xe;
  edge_graph._M_len = 0x1e;
  edge_graph._M_array = (iterator)local_218;
  Disa::Adjacency_Graph<false>::Adjacency_Graph(&local_248,edge_graph);
  local_280._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       Disa::pseudo_peripheral_vertex<Disa::Adjacency_Graph<false>>(&local_248,0xb);
  local_288.data_._0_4_ = 5;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_218,"pseudo_peripheral_vertex(graph_saad, 11)","5",
             (unsigned_long *)&local_280,(int *)&local_288);
  if (local_218[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_280);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_210._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((_Alloc_hider *)&(_Stack_210._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_288,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_graph_utilities.cpp"
               ,0x76,pcVar7);
    testing::internal::AssertHelper::operator=(&local_288,(Message *)&local_280);
    testing::internal::AssertHelper::~AssertHelper(&local_288);
    if (local_280._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_280._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_210._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_210,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_210._M_pi);
  }
  local_280._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       Disa::pseudo_peripheral_vertex<Disa::Adjacency_Graph<false>>(&local_248,2);
  local_288.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_218,"pseudo_peripheral_vertex(graph_saad, 2)","0",
             (unsigned_long *)&local_280,(int *)&local_288);
  if (local_218[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_280);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_210._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((_Alloc_hider *)&(_Stack_210._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_288,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_graph_utilities.cpp"
               ,0x77,pcVar7);
    testing::internal::AssertHelper::operator=(&local_288,(Message *)&local_280);
    testing::internal::AssertHelper::~AssertHelper(&local_288);
    if (local_280._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_280._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_210._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_210,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_210._M_pi);
  }
  local_218 = (undefined1  [8])0x0;
  _Stack_210._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&DAT_0000000f;
  Disa::Adjacency_Graph<false>::insert(&local_248,(Edge *)local_218);
  local_280._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       Disa::pseudo_peripheral_vertex<Disa::Adjacency_Graph<false>>(&local_248,5);
  local_288.data_._0_4_ = 0xf;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_218,"pseudo_peripheral_vertex(graph_saad, 5)","15",
             (unsigned_long *)&local_280,(int *)&local_288);
  if (local_218[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_280);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_210._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((_Alloc_hider *)&(_Stack_210._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_288,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_graph_utilities.cpp"
               ,0x7b,pcVar7);
    testing::internal::AssertHelper::operator=(&local_288,(Message *)&local_280);
    testing::internal::AssertHelper::~AssertHelper(&local_288);
    if (local_280._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_280._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_210._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_210,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_210._M_pi);
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    local_280._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1491ce;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)local_218,
               (testing *)&local_280,regex);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_260,(PolymorphicMatcher *)local_218);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_210._M_pi !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_210._M_pi);
    }
    bVar4 = testing::internal::DeathTest::Create
                      ("pseudo_peripheral_vertex(Adjacency_Graph<false>())",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_260,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_graph_utilities.cpp"
                       ,0x7e,(DeathTest **)&local_288);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_260);
    bVar3 = true;
    if (bVar4) {
      plVar1 = (long *)CONCAT44(local_288.data_._4_4_,local_288.data_._0_4_);
      if (plVar1 != (long *)0x0) {
        iVar6 = (**(code **)(*plVar1 + 0x10))(plVar1);
        if (iVar6 == 0) {
          plVar2 = (long *)CONCAT44(local_288.data_._4_4_,local_288.data_._0_4_);
          iVar6 = (**(code **)(*plVar2 + 0x18))(plVar2);
          bVar3 = testing::internal::ExitedUnsuccessfully(iVar6);
          cVar5 = (**(code **)(*plVar2 + 0x20))(plVar2,bVar3);
          if (cVar5 != '\0') goto LAB_0010e659;
          bVar3 = true;
          bVar4 = false;
        }
        else {
          if (iVar6 == 1) {
            plVar2 = (long *)CONCAT44(local_288.data_._4_4_,local_288.data_._0_4_);
            bVar3 = testing::internal::AlwaysTrue();
            if (bVar3) {
              local_1f8 = (pointer)0x0;
              puStack_1f0 = (pointer)0x0;
              local_208 = (pointer)0x0;
              puStack_200 = (pointer)0x0;
              local_218 = (undefined1  [8])0x0;
              _Stack_210._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              Disa::pseudo_peripheral_vertex<Disa::Adjacency_Graph<false>>
                        ((Adjacency_Graph<false> *)local_218,0);
              Disa::Adjacency_Graph<false>::~Adjacency_Graph((Adjacency_Graph<false> *)local_218);
            }
            (**(code **)(*(long *)CONCAT44(local_288.data_._4_4_,local_288.data_._0_4_) + 0x28))
                      ((long *)CONCAT44(local_288.data_._4_4_,local_288.data_._0_4_),2);
            (**(code **)(*plVar2 + 0x28))(plVar2,0);
          }
LAB_0010e659:
          bVar3 = false;
          bVar4 = true;
        }
        (**(code **)(*plVar1 + 8))(plVar1);
        if (!bVar4) goto LAB_0010e66c;
      }
      bVar3 = false;
    }
LAB_0010e66c:
    if (bVar3) goto LAB_0010e670;
  }
  else {
LAB_0010e670:
    testing::Message::Message((Message *)local_218);
    pcVar7 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_graph_utilities.cpp"
               ,0x7e,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_280,(Message *)local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_280);
    if (local_218 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_218 + 8))();
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    local_280._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1491ce;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)local_218,
               (testing *)&local_280,regex_00);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_278,(PolymorphicMatcher *)local_218);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_210._M_pi !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_210._M_pi);
    }
    bVar4 = testing::internal::DeathTest::Create
                      ("pseudo_peripheral_vertex(graph_saad, 16)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_278,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_graph_utilities.cpp"
                       ,0x7f,(DeathTest **)&local_288);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_278);
    bVar3 = true;
    if (bVar4) {
      plVar1 = (long *)CONCAT44(local_288.data_._4_4_,local_288.data_._0_4_);
      if (plVar1 != (long *)0x0) {
        iVar6 = (**(code **)(*plVar1 + 0x10))(plVar1);
        if (iVar6 == 0) {
          plVar2 = (long *)CONCAT44(local_288.data_._4_4_,local_288.data_._0_4_);
          iVar6 = (**(code **)(*plVar2 + 0x18))(plVar2);
          bVar3 = testing::internal::ExitedUnsuccessfully(iVar6);
          cVar5 = (**(code **)(*plVar2 + 0x20))(plVar2,bVar3);
          if (cVar5 != '\0') goto LAB_0010e7c2;
          bVar3 = true;
          bVar4 = false;
        }
        else {
          if (iVar6 == 1) {
            plVar2 = (long *)CONCAT44(local_288.data_._4_4_,local_288.data_._0_4_);
            bVar3 = testing::internal::AlwaysTrue();
            if (bVar3) {
              Disa::pseudo_peripheral_vertex<Disa::Adjacency_Graph<false>>(&local_248,0x10);
            }
            (**(code **)(*(long *)CONCAT44(local_288.data_._4_4_,local_288.data_._0_4_) + 0x28))
                      ((long *)CONCAT44(local_288.data_._4_4_,local_288.data_._0_4_),2);
            (**(code **)(*plVar2 + 0x28))(plVar2,0);
          }
LAB_0010e7c2:
          bVar3 = false;
          bVar4 = true;
        }
        (**(code **)(*plVar1 + 8))(plVar1);
        if (!bVar4) goto LAB_0010e7d5;
      }
      bVar3 = false;
    }
LAB_0010e7d5:
    if (!bVar3) goto LAB_0010e82f;
  }
  testing::Message::Message((Message *)local_218);
  pcVar7 = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_280,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_graph_utilities.cpp"
             ,0x7f,pcVar7);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_280,(Message *)local_218);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_280);
  if (local_218 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_218 + 8))();
  }
LAB_0010e82f:
  Disa::Adjacency_Graph<false>::~Adjacency_Graph(&local_248);
  return;
}

Assistant:

TEST(test_graph_utilities, pseudo_peripheral_vertex) {

  Adjacency_Graph graph_saad = create_graph_saad();

  // Check to get the end vertices.
  EXPECT_EQ(pseudo_peripheral_vertex(graph_saad, 11), 5);
  EXPECT_EQ(pseudo_peripheral_vertex(graph_saad, 2), 0);

  // Insert a new edge, then search from the otheside of the graph, this should be the new peripheral vertex.
  graph_saad.insert({0, 15});
  EXPECT_EQ(pseudo_peripheral_vertex(graph_saad, 5), 15);

  // Death test.
  EXPECT_DEATH(pseudo_peripheral_vertex(Adjacency_Graph<false>()), "./*");
  EXPECT_DEATH(pseudo_peripheral_vertex(graph_saad, 16), "./*");
}